

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cpp
# Opt level: O2

bool __thiscall
ArgsManager::ReadConfigStream
          (ArgsManager *this,istream *stream,string *filepath,string *error,bool ignore_invalid_keys
          )

{
  long lVar1;
  string key;
  pointer ppVar2;
  bool bVar3;
  int iVar4;
  istream *piVar5;
  size_type sVar6;
  size_type __n;
  optional<unsigned_int> oVar7;
  mapped_type *this_00;
  mapped_type *this_01;
  char *args;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar8;
  pointer __str;
  undefined4 uVar9;
  undefined7 in_register_00000081;
  char *pcVar10;
  long in_FS_OFFSET;
  string_view pattern;
  string_view pattern_00;
  string_view str_00;
  string_view str_01;
  string_view pattern_01;
  string_view source_file;
  string_view logging_function;
  basic_string_view<char,_std::char_traits<char>_> bVar11;
  undefined8 in_stack_fffffffffffffe48;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>_>_>_>
  *this_02;
  undefined4 in_stack_fffffffffffffe60;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  options;
  string_view value;
  int local_154;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock2;
  optional<UniValue> value_1;
  string local_e0 [32];
  string str;
  key_type local_a0;
  string section;
  string prefix;
  
  uVar9 = (undefined4)CONCAT71(in_register_00000081,ignore_invalid_keys);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pcVar10 = (char *)0x0;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock2,&this->cs_args,"cs_args",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/common/config.cpp"
             ,0x5e,false);
  options.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  str._M_dataplus._M_p = (pointer)&str.field_2;
  str._M_string_length = 0;
  options.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  options.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  str.field_2._M_local_buf[0] = '\0';
  prefix._M_dataplus._M_p = (pointer)&prefix.field_2;
  prefix._M_string_length = 0;
  prefix.field_2._M_local_buf[0] = '\0';
  local_154 = 1;
  while( true ) {
    piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>(stream,(string *)&str);
    args = *(char **)(*(long *)piVar5 + -0x18);
    if (((byte)(piVar5 + 0x20)[(long)args] & 5) != 0) break;
    sVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                      (&str,'#',0);
    if (sVar6 != 0xffffffffffffffff) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&value_1,&str,
                 0,sVar6);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&str,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&value_1)
      ;
      std::__cxx11::string::~string((string *)&value_1);
    }
    if (GetConfigOptions(std::istream&,std::__cxx11::string_const&,std::__cxx11::string&,std::vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>&,std::__cxx11::list<SectionInfo,std::allocator<SectionInfo>>&)
        ::pattern_abi_cxx11_ == '\0') {
      iVar4 = __cxa_guard_acquire(&GetConfigOptions(std::istream&,std::__cxx11::string_const&,std::__cxx11::string&,std::vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>&,std::__cxx11::list<SectionInfo,std::allocator<SectionInfo>>&)
                                   ::pattern_abi_cxx11_);
      if (iVar4 != 0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)
                   &GetConfigOptions(std::istream&,std::__cxx11::string_const&,std::__cxx11::string&,std::vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>&,std::__cxx11::list<SectionInfo,std::allocator<SectionInfo>>&)
                    ::pattern_abi_cxx11_," \t\r\n",(allocator<char> *)&value_1);
        __cxa_atexit(std::__cxx11::string::~string,
                     &GetConfigOptions(std::istream&,std::__cxx11::string_const&,std::__cxx11::string&,std::vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>&,std::__cxx11::list<SectionInfo,std::allocator<SectionInfo>>&)
                      ::pattern_abi_cxx11_,&__dso_handle);
        __cxa_guard_release(&GetConfigOptions(std::istream&,std::__cxx11::string_const&,std::__cxx11::string&,std::vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>&,std::__cxx11::list<SectionInfo,std::allocator<SectionInfo>>&)
                             ::pattern_abi_cxx11_);
      }
    }
    pattern._M_str = pcVar10;
    pattern._M_len =
         (size_t)GetConfigOptions(std::istream&,std::__cxx11::string_const&,std::__cxx11::string&,std::vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>&,std::__cxx11::list<SectionInfo,std::allocator<SectionInfo>>&)
                 ::pattern_abi_cxx11_;
    str_00._M_str = DAT_01164160;
    str_00._M_len = (size_t)str._M_dataplus._M_p;
    pbVar8 = GetConfigOptions(std::istream&,std::__cxx11::string_const&,std::__cxx11::string&,std::vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>&,std::__cxx11::list<SectionInfo,std::allocator<SectionInfo>>&)
             ::pattern_abi_cxx11_;
    util::TrimString_abi_cxx11_((string *)&value_1,(util *)str._M_string_length,str_00,pattern);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&str,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&value_1);
    std::__cxx11::string::~string((string *)&value_1);
    if (str._M_string_length != 0) {
      if (*str._M_dataplus._M_p != '[') {
        if (*str._M_dataplus._M_p == '-') {
          tinyformat::format<int,std::__cxx11::string>
                    ((string *)&value_1,
                     (tinyformat *)
                     "parse error on line %i: %s, options in configuration file must be specified without leading -"
                     ,(char *)&local_154,(int *)&str,pbVar8);
          pbVar8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&value_1;
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    (error,pbVar8);
LAB_00a5faa5:
          std::__cxx11::string::~string((string *)pbVar8);
        }
        else {
LAB_00a5f65d:
          __n = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                find(&str,'=',0);
          if (__n != 0xffffffffffffffff) {
            value._M_str = str._M_dataplus._M_p;
            value._M_len = str._M_string_length;
            bVar11 = std::basic_string_view<char,_std::char_traits<char>_>::substr(&value,0,__n);
            str_01._M_len = bVar11._M_str;
            pattern_00._M_str = pcVar10;
            pattern_00._M_len =
                 (size_t)GetConfigOptions(std::istream&,std::__cxx11::string_const&,std::__cxx11::string&,std::vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>&,std::__cxx11::list<SectionInfo,std::allocator<SectionInfo>>&)
                         ::pattern_abi_cxx11_;
            str_01._M_str = DAT_01164160;
            util::TrimString_abi_cxx11_((string *)&value_1,(util *)bVar11._M_len,str_01,pattern_00);
            std::operator+(&section,&prefix,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &value_1);
            std::__cxx11::string::~string((string *)&value_1);
            value_1.super__Optional_base<UniValue,_false,_false>._M_payload.
            super__Optional_payload<UniValue,_true,_false,_false>.
            super__Optional_payload_base<UniValue>._M_payload._0_8_ = str._M_string_length;
            value_1.super__Optional_base<UniValue,_false,_false>._M_payload.
            super__Optional_payload<UniValue,_true,_false,_false>.
            super__Optional_payload_base<UniValue>._M_payload._M_value.val._M_dataplus._M_p =
                 (_Alloc_hider)(_Alloc_hider)str._M_dataplus._M_p;
            bVar11 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                               ((basic_string_view<char,_std::char_traits<char>_> *)&value_1,__n + 1
                                ,0xffffffffffffffff);
            pattern_01._M_str =
                 (char *)GetConfigOptions(std::istream&,std::__cxx11::string_const&,std::__cxx11::string&,std::vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>&,std::__cxx11::list<SectionInfo,std::allocator<SectionInfo>>&)
                         ::pattern_abi_cxx11_;
            pattern_01._M_len = (size_t)DAT_01164160;
            value = util::TrimStringView(bVar11,pattern_01);
            if (sVar6 != 0xffffffffffffffff) {
              sVar6 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                                (&section,"rpcpassword",0);
              if (sVar6 != 0xffffffffffffffff) {
                tinyformat::format<int>
                          ((string *)&value_1,
                           "parse error on line %i, using # in rpcpassword can be ambiguous and should be avoided"
                           ,&local_154);
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                operator=(error,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&value_1);
                std::__cxx11::string::~string((string *)&value_1);
                pbVar8 = &section;
                goto LAB_00a5faa5;
              }
            }
            std::
            vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
            ::
            emplace_back<std::__cxx11::string&,std::basic_string_view<char,std::char_traits<char>>&>
                      ((vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                        *)&options,&section,&value);
            sVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::rfind(&section,'.',0xffffffffffffffff);
            if ((sVar6 != 0xffffffffffffffff) && (prefix._M_string_length <= sVar6)) {
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              substr((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&value_1,
                     &section,0,sVar6);
              std::__cxx11::string::string
                        ((string *)
                         ((long)&value_1.super__Optional_base<UniValue,_false,_false>._M_payload.
                                 super__Optional_payload<UniValue,_true,_false,_false>.
                                 super__Optional_payload_base<UniValue>._M_payload._M_value.val +
                         0x18),filepath);
              value_1.super__Optional_base<UniValue,_false,_false>._M_payload.
              super__Optional_payload<UniValue,_true,_false,_false>.
              super__Optional_payload_base<UniValue>._M_payload._64_4_ = local_154;
              std::__cxx11::list<SectionInfo,_std::allocator<SectionInfo>_>::
              emplace_back<SectionInfo>(&this->m_config_sections,(SectionInfo *)&value_1);
              SectionInfo::~SectionInfo((SectionInfo *)&value_1);
            }
            goto LAB_00a5f7be;
          }
          tinyformat::format<int,std::__cxx11::string>
                    ((string *)&value_1,(tinyformat *)"parse error on line %i: %s",
                     (char *)&local_154,(int *)&str,pbVar8);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    (error,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &value_1);
          std::__cxx11::string::~string((string *)&value_1);
          if (1 < str._M_string_length) {
            pbVar8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2;
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&value_1
                       ,&str,0,2);
            bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&value_1,"no");
            std::__cxx11::string::~string((string *)&value_1);
            if (bVar3) {
              tinyformat::format<std::__cxx11::string>
                        ((string *)&value_1,
                         (tinyformat *)
                         ", if you intended to specify a negated option, use %s=1 instead",
                         (char *)&str,pbVar8);
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              append(error,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &value_1);
              pbVar8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&value_1
              ;
              goto LAB_00a5faa5;
            }
          }
        }
        std::__cxx11::string::~string((string *)&prefix);
        std::__cxx11::string::~string((string *)&str);
        goto LAB_00a5fb0d;
      }
      if (str._M_dataplus._M_p[str._M_string_length - 1] != ']') goto LAB_00a5f65d;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                (&section,&str,1,str._M_string_length - 2);
      std::__cxx11::string::string((string *)&value_1,&section);
      std::__cxx11::string::string
                ((string *)
                 ((long)&value_1.super__Optional_base<UniValue,_false,_false>._M_payload.
                         super__Optional_payload<UniValue,_true,_false,_false>.
                         super__Optional_payload_base<UniValue>._M_payload._M_value.val + 0x18),
                 filepath);
      value_1.super__Optional_base<UniValue,_false,_false>._M_payload.
      super__Optional_payload<UniValue,_true,_false,_false>.super__Optional_payload_base<UniValue>.
      _M_payload._64_4_ = local_154;
      std::__cxx11::list<SectionInfo,_std::allocator<SectionInfo>_>::emplace_back<SectionInfo>
                (&this->m_config_sections,(SectionInfo *)&value_1);
      SectionInfo::~SectionInfo((SectionInfo *)&value_1);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&value_1,
                     &section,'.');
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&prefix,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &value_1);
      std::__cxx11::string::~string((string *)&value_1);
LAB_00a5f7be:
      std::__cxx11::string::~string((string *)&section);
    }
    local_154 = local_154 + 1;
  }
  std::__cxx11::string::~string((string *)&prefix);
  std::__cxx11::string::~string((string *)&str);
  ppVar2 = options.
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  this_02 = &(this->m_settings).ro_config;
  __str = options.
          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
  do {
    if (__str == ppVar2) {
      bVar3 = true;
LAB_00a5fb0f:
      std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~vector(&options);
      std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock2.super_unique_lock);
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        return bVar3;
      }
      __stack_chk_fail();
    }
    std::__cxx11::string::string(local_e0,&__str->first);
    key._M_string_length = (size_type)error;
    key._M_dataplus._M_p = (pointer)in_stack_fffffffffffffe48;
    key.field_2._M_allocated_capacity = (size_type)this_02;
    key.field_2._8_4_ = in_stack_fffffffffffffe60;
    key.field_2._12_4_ = uVar9;
    InterpretKey((KeyInfo *)&str,key);
    std::__cxx11::string::~string(local_e0);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&value_1,'-'
                   ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&str);
    oVar7 = GetArgFlags(this,(string *)&value_1);
    std::__cxx11::string::~string((string *)&value_1);
    bVar3 = IsConfSupported((KeyInfo *)&str,error);
    if (!bVar3) {
LAB_00a5fb00:
      KeyInfo::~KeyInfo((KeyInfo *)&str);
LAB_00a5fb0d:
      bVar3 = false;
      goto LAB_00a5fb0f;
    }
    if (((ulong)oVar7.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                super__Optional_payload_base<unsigned_int> >> 0x20 & 1) == 0) {
      if ((char)uVar9 == '\0') {
        tinyformat::format<std::__cxx11::string>
                  ((string *)&value_1,(tinyformat *)"Invalid configuration value %s",(char *)__str,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (error,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &value_1);
        std::__cxx11::string::~string((string *)&value_1);
        goto LAB_00a5fb00;
      }
      source_file._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/common/config.cpp"
      ;
      source_file._M_len = 0x61;
      args = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/common/config.cpp"
      ;
      logging_function._M_str = "ReadConfigStream";
      logging_function._M_len = 0x10;
      LogPrintFormatInternal<std::__cxx11::string>
                (logging_function,source_file,0x6f,ALL,Info,(ConstevalFormatString<1U>)0xe23a85,
                 &__str->first);
    }
    else {
      args = (char *)((ulong)oVar7.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                             super__Optional_payload_base<unsigned_int> & 0xffffffff);
      InterpretValue(&value_1,(KeyInfo *)&str,&__str->second,
                     oVar7.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                     super__Optional_payload_base<unsigned_int>._M_payload,error);
      if (value_1.super__Optional_base<UniValue,_false,_false>._M_payload.
          super__Optional_payload<UniValue,_true,_false,_false>.
          super__Optional_payload_base<UniValue>._M_engaged == false) {
        std::_Optional_payload_base<UniValue>::_M_reset
                  ((_Optional_payload_base<UniValue> *)&value_1);
        goto LAB_00a5fb00;
      }
      this_00 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>_>_>_>
                ::operator[](this_02,&local_a0);
      this_01 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>
                ::operator[](this_00,(key_type *)&str);
      std::vector<UniValue,_std::allocator<UniValue>_>::push_back(this_01,(value_type *)&value_1);
      std::_Optional_payload_base<UniValue>::_M_reset((_Optional_payload_base<UniValue> *)&value_1);
    }
    KeyInfo::~KeyInfo((KeyInfo *)&str);
    __str = __str + 1;
  } while( true );
}

Assistant:

bool ArgsManager::ReadConfigStream(std::istream& stream, const std::string& filepath, std::string& error, bool ignore_invalid_keys)
{
    LOCK(cs_args);
    std::vector<std::pair<std::string, std::string>> options;
    if (!GetConfigOptions(stream, filepath, error, options, m_config_sections)) {
        return false;
    }
    for (const std::pair<std::string, std::string>& option : options) {
        KeyInfo key = InterpretKey(option.first);
        std::optional<unsigned int> flags = GetArgFlags('-' + key.name);
        if (!IsConfSupported(key, error)) return false;
        if (flags) {
            std::optional<common::SettingsValue> value = InterpretValue(key, &option.second, *flags, error);
            if (!value) {
                return false;
            }
            m_settings.ro_config[key.section][key.name].push_back(*value);
        } else {
            if (ignore_invalid_keys) {
                LogPrintf("Ignoring unknown configuration value %s\n", option.first);
            } else {
                error = strprintf("Invalid configuration value %s", option.first);
                return false;
            }
        }
    }
    return true;
}